

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O2

StrScanFmt lj_strscan_scan(uint8_t *p,MSize len,TValue *o,uint32_t opt)

{
  StrScanFmt SVar1;
  uint32_t uVar2;
  StrScanFmt SVar3;
  long lVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint32_t uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  byte *pbVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  byte bVar20;
  uint uVar21;
  byte *pbVar22;
  uint uVar23;
  long lVar24;
  byte bVar25;
  uint uVar26;
  byte *pbVar27;
  bool bVar28;
  bool bVar29;
  double n;
  lua_Number lVar30;
  double dVar31;
  uint local_258;
  byte local_238 [520];
  
  pbVar16 = p + len;
  uVar6 = (ulong)*p;
  bVar28 = false;
  pbVar27 = p;
  if ((""[uVar6 + 1] & 8) == 0) {
    do {
      p = pbVar27;
      bVar13 = *p;
      uVar6 = (ulong)bVar13;
      pbVar27 = p + 1;
    } while ((""[uVar6 + 1] & 2) != 0);
    if ((bVar13 == 0x2b) || (bVar13 == 0x2d)) {
      local_258 = (uint)(bVar13 == 0x2d);
      uVar6 = (ulong)*pbVar27;
      p = pbVar27;
    }
    else {
      local_258 = 0;
    }
    if (0x40 < (byte)uVar6) {
      uVar5 = 0xfff8000000000000;
      bVar13 = (byte)uVar6 & 0xdf;
      pbVar27 = p;
      if (bVar13 == 0x4e) {
        if ((p[1] & 0xdf) == 0x41) {
          pbVar27 = p + (ulong)((p[2] & 0xdf) == 0x4e) * 3;
        }
      }
      else if (((bVar13 == 0x49) && ((p[1] & 0xdf) == 0x4e)) && ((p[2] & 0xdf) == 0x46)) {
        uVar5 = 0xfff0000000000000;
        if (local_258 == 0) {
          uVar5 = 0x7ff0000000000000;
        }
        pbVar22 = p + 3;
        pbVar27 = pbVar22;
        if ((((p[3] & 0xdf) == 0x49) && ((p[4] & 0xdf) == 0x4e)) &&
           (((p[5] & 0xdf) == 0x49 &&
            (((p[6] & 0xdf) == 0x54 && (pbVar27 = p + 8, (p[7] & 0xdf) != 0x59)))))) {
          pbVar27 = pbVar22;
        }
      }
      pbVar27 = pbVar27 + -1;
      do {
        pbVar22 = pbVar27 + 1;
        pbVar27 = pbVar27 + 1;
      } while ((""[(ulong)*pbVar22 + 1] & 2) != 0);
      if (pbVar27 < pbVar16 || *pbVar22 != 0) {
        return STRSCAN_ERROR;
      }
      goto LAB_0011967c;
    }
  }
  else {
    local_258 = 0;
  }
  bVar12 = (byte)uVar6;
  bVar13 = 10;
  if (bVar12 == 0x30) {
    bVar13 = 0;
  }
  if ((opt & 0x10) == 0) {
    bVar13 = 10;
  }
  bVar25 = 8;
  if (bVar12 < 0x31) {
    if (bVar12 == 0x30) {
      if ((p[1] | 0x20) == 0x62) {
        p = p + 2;
        bVar13 = 2;
      }
      else if ((p[1] | 0x20) == 0x78) {
        p = p + 2;
        bVar25 = 0x10;
        bVar13 = bVar25;
      }
    }
    pbVar27 = (byte *)0x0;
    bVar28 = false;
    do {
      bVar12 = *p;
      uVar6 = (ulong)bVar12;
      if (bVar12 == 0x30) {
        bVar28 = true;
      }
      else {
        if (bVar12 != 0x2e) goto LAB_001193f0;
        bVar29 = pbVar27 != (byte *)0x0;
        pbVar27 = p;
        if (bVar29) {
          return STRSCAN_ERROR;
        }
      }
      p = p + 1;
    } while( true );
  }
  pbVar27 = (byte *)0x0;
LAB_001193f0:
  bVar12 = (byte)uVar6;
  SVar1 = STRSCAN_NUM;
  lVar24 = 0;
  uVar11 = 0;
  uVar23 = 0;
  do {
    bVar20 = (byte)uVar6;
    if ((bVar25 & ""[uVar6 + 1]) == 0) {
      if (bVar20 != 0x2e) {
        if (!bVar28 && uVar11 == 0) {
          return STRSCAN_ERROR;
        }
        if (pbVar27 == (byte *)0x0) {
          uVar14 = 0;
          SVar1 = STRSCAN_INT;
          goto LAB_001194b4;
        }
        if (bVar13 == 2) {
          return STRSCAN_ERROR;
        }
        if (uVar11 != 0) {
          uVar14 = ((int)pbVar27 + (1 - (int)p)) - (int)lVar24;
          uVar26 = uVar14 * 4;
          lVar4 = 0;
          break;
        }
        uVar11 = 0;
        uVar14 = 0;
        goto LAB_001194b4;
      }
      if (pbVar27 != (byte *)0x0) {
        return STRSCAN_ERROR;
      }
      pbVar27 = p + lVar24;
    }
    else {
      uVar23 = (uint)(bVar20 & 0xf) + uVar23 * 10;
      uVar11 = uVar11 + 1;
    }
    uVar6 = (ulong)p[lVar24 + 1];
    lVar24 = lVar24 + 1;
  } while( true );
LAB_00119476:
  if (-1 < (int)uVar14) goto LAB_001194ab;
  if (p[lVar24 + lVar4 + -1] != 0x30) {
    if (uVar14 < 0xfff00001) {
      return STRSCAN_ERROR;
    }
    goto LAB_001194ab;
  }
  uVar14 = uVar14 + 1;
  lVar4 = lVar4 + -1;
  uVar26 = uVar26 + 4;
  goto LAB_00119476;
LAB_001194ab:
  if (bVar13 == 0x10) {
    uVar14 = uVar26;
  }
  uVar11 = uVar11 + (int)lVar4;
LAB_001194b4:
  pbVar27 = p + lVar24;
  if (9 < bVar13) {
    bVar25 = 0x65;
    if (bVar13 == 0x10) {
      bVar25 = 0x70;
    }
    if (bVar25 == (bVar20 | 0x20)) {
      bVar25 = p[lVar24 + 1];
      if ((bVar25 == 0x2b) || (bVar25 == 0x2d)) {
        pbVar27 = p + lVar24 + 2;
        bVar28 = bVar25 != 0x2d;
        bVar25 = *pbVar27;
      }
      else {
        pbVar27 = p + lVar24 + 1;
        bVar28 = true;
      }
      if ((""[(ulong)bVar25 + 1] & 8) == 0) {
        return STRSCAN_ERROR;
      }
      uVar26 = (uint)(bVar25 & 0xf);
      while( true ) {
        pbVar27 = pbVar27 + 1;
        bVar20 = *pbVar27;
        if ((""[(ulong)bVar20 + 1] & 8) == 0) break;
        uVar26 = (bVar20 & 0xf) + uVar26 * 10;
        if (0xfffff < uVar26) {
          return STRSCAN_ERROR;
        }
      }
      uVar18 = -uVar26;
      if (bVar28) {
        uVar18 = uVar26;
      }
      uVar14 = uVar18 + uVar14;
      SVar1 = STRSCAN_NUM;
    }
  }
  if (bVar20 != 0) {
    if ((bVar20 | 0x20) == 0x69) {
      if ((opt & 4) == 0) {
        return STRSCAN_ERROR;
      }
      pbVar27 = pbVar27 + 1;
      SVar1 = STRSCAN_IMAG;
    }
    else if (SVar1 == STRSCAN_INT) {
      bVar28 = (bVar20 | 0x20) == 0x75;
      SVar1 = bVar28 + STRSCAN_INT;
      pbVar22 = pbVar27 + bVar28;
      if ((pbVar27[bVar28] & 0xdf) == 0x4c) {
        if ((pbVar22[1] & 0xdf) == 0x4c) {
          pbVar22 = pbVar22 + 2;
        }
        else {
          if ((opt & 0x10) == 0) {
            return STRSCAN_ERROR;
          }
          pbVar22 = pbVar22 + 1;
        }
        SVar1 = bVar28 + STRSCAN_I64;
      }
      if (((*pbVar22 & 0xdf) == 0x55) && ((SVar1 == STRSCAN_I64 || (SVar1 == STRSCAN_INT)))) {
        pbVar22 = pbVar22 + 1;
        SVar1 = SVar1 + STRSCAN_NUM;
      }
      if (((opt & 0x10) == 0) && (SVar1 == STRSCAN_U32)) {
        return STRSCAN_ERROR;
      }
      pbVar27 = pbVar22;
      if (((opt & 8) == 0) && (STRSCAN_U32 < SVar1)) {
        return STRSCAN_ERROR;
      }
    }
    pbVar27 = pbVar27 + -1;
    do {
      pbVar22 = pbVar27 + 1;
      pbVar27 = pbVar27 + 1;
    } while ((""[(ulong)*pbVar22 + 1] & 2) != 0);
    if (*pbVar22 != 0) {
      return STRSCAN_ERROR;
    }
  }
  if (pbVar27 < pbVar16) {
    return STRSCAN_ERROR;
  }
  if (((SVar1 == STRSCAN_INT) && (bVar13 == 10)) &&
     ((uVar11 < 10 || (((uVar11 == 10 && (bVar12 < 0x33)) && (uVar23 < local_258 + 0x80000000))))))
  {
    if ((opt & 2) != 0) {
      lVar30 = (lua_Number)uVar23;
      if (local_258 != 0) {
        lVar30 = (lua_Number)((ulong)lVar30 | (ulong)DAT_00158940);
      }
      o->n = lVar30;
      return STRSCAN_NUM;
    }
    if ((local_258 != 0) && (uVar23 == 0)) {
      uVar5 = 0x8000000000000000;
LAB_0011967c:
      o->u64 = uVar5;
      return STRSCAN_NUM;
    }
    uVar7 = -uVar23;
    if (local_258 == 0) {
      uVar7 = uVar23;
    }
    goto LAB_00119e0d;
  }
  if ((bVar13 == 0) && (1 < SVar1 - STRSCAN_NUM)) {
    if (0x16 < uVar11) {
      return STRSCAN_ERROR;
    }
    if ((uVar11 == 0x16) && (0x31 < bVar12)) {
      return STRSCAN_ERROR;
    }
    uVar6 = 0;
    for (lVar24 = 0; uVar11 != (uint)lVar24; lVar24 = lVar24 + 1) {
      if ((p[lVar24] & 0xf8) != 0x30) {
        return STRSCAN_ERROR;
      }
      uVar6 = (ulong)(p[lVar24] & 7) + uVar6 * 8;
    }
    if (SVar1 != STRSCAN_U32) {
      if (SVar1 != STRSCAN_INT) {
        uVar9 = -uVar6;
        if (local_258 == 0) {
          uVar9 = uVar6;
        }
        o->u64 = uVar9;
        return SVar1;
      }
      SVar1 = STRSCAN_U32 - (uVar6 < local_258 + 0x80000000);
    }
    if (uVar6 >> 0x20 != 0) {
      return STRSCAN_ERROR;
    }
    uVar7 = -(uint32_t)uVar6;
    if (local_258 == 0) {
      uVar7 = (uint32_t)uVar6;
    }
    (o->u32).lo = uVar7;
    return SVar1;
  }
  if (bVar13 == 2) {
    SVar3 = STRSCAN_ERROR;
    if ((uVar11 < 0x41) && (uVar14 == 0)) {
      uVar6 = 0;
      for (lVar24 = 0; uVar11 != (uint)lVar24; lVar24 = lVar24 + 1) {
        if ((p[lVar24] & 0xfffffffe) != 0x30) goto LAB_001198e9;
        uVar6 = (ulong)(p[lVar24] & 1) + uVar6 * 2;
      }
      if (SVar1 - STRSCAN_I64 < 2) {
LAB_00119aff:
        uVar9 = -uVar6;
LAB_00119d8e:
        if (local_258 == 0) {
          uVar9 = uVar6;
        }
        o->u64 = uVar9;
        SVar3 = SVar1;
      }
      else {
        if (SVar1 != STRSCAN_U32) {
          if (SVar1 == STRSCAN_INT) {
            if (((opt & 2) == 0) && (uVar6 < local_258 + 0x80000000)) goto LAB_00119ae5;
            if ((opt & 0x10) != 0) goto LAB_00119cf6;
            SVar1 = STRSCAN_NUM;
          }
          bVar28 = uVar6 >> 0x3e != 0;
          uVar9 = (ulong)((uint)uVar6 & 3) | uVar6 >> 2;
          if (!bVar28) {
            uVar9 = uVar6;
          }
          uVar11 = (uint)bVar28 * 2;
          goto LAB_00119be5;
        }
LAB_00119cf6:
        if (0x20 < uVar11) goto LAB_001198e9;
LAB_001197ce:
        uVar7 = -(uint32_t)uVar6;
        if (local_258 == 0) {
          uVar7 = (uint32_t)uVar6;
        }
        (o->u32).lo = uVar7;
        SVar3 = STRSCAN_U32;
      }
    }
  }
  else if (bVar13 == 0x10) {
    uVar23 = 0x10;
    uVar26 = 0x10;
    if (uVar11 < 0x10) {
      uVar26 = uVar11;
    }
    uVar6 = 0;
    while (bVar28 = uVar26 != 0, uVar26 = uVar26 - 1, bVar28) {
      bVar13 = *p;
      if (bVar13 == 0x2e) {
        bVar13 = p[1];
        p = p + 1;
      }
      uVar18 = bVar13 + 9;
      if (bVar13 < 0x3a) {
        uVar18 = (uint)bVar13;
      }
      uVar6 = uVar6 << 4 | (ulong)(uVar18 & 0xf);
      p = p + 1;
    }
    for (; uVar23 < uVar11; uVar23 = uVar23 + 1) {
      bVar13 = *p;
      if (bVar13 == 0x2e) {
        bVar13 = p[1];
        p = p + 1;
      }
      uVar6 = uVar6 | bVar13 != 0x30;
      uVar14 = uVar14 + 4;
      p = p + 1;
    }
    if (SVar1 - STRSCAN_I64 < 2) {
      if (uVar11 < 0x11) goto LAB_00119aff;
    }
    else {
      if (SVar1 != STRSCAN_U32) {
        if (SVar1 == STRSCAN_INT) {
          if ((((opt & 2) == 0) && (uVar6 < local_258 + 0x80000000)) &&
             ((local_258 == 0 || (uVar6 != 0)))) {
LAB_00119ae5:
            uVar7 = -(uint32_t)uVar6;
            if (local_258 == 0) {
              uVar7 = (uint32_t)uVar6;
            }
            (o->u32).lo = uVar7;
            SVar3 = STRSCAN_INT;
            goto LAB_00119dc2;
          }
          if ((opt & 0x10) != 0) goto LAB_001197c5;
          SVar1 = STRSCAN_NUM;
        }
        uVar9 = (ulong)((uint)uVar6 & 3) | uVar6 >> 2;
        uVar11 = uVar14 + 2;
        if (uVar6 >> 0x3e == 0) {
          uVar9 = uVar6;
          uVar11 = uVar14;
        }
LAB_00119be5:
        strscan_double(uVar9,o,uVar11,local_258);
        SVar3 = SVar1;
        goto LAB_00119dc2;
      }
LAB_001197c5:
      if (uVar11 < 9) goto LAB_001197ce;
    }
LAB_001198e9:
    SVar3 = STRSCAN_ERROR;
  }
  else {
    if (uVar11 == 0) {
      pbVar27 = local_238;
      local_238[0] = 0;
      uVar14 = 0;
      uVar11 = 0;
LAB_00119927:
      if ((uVar14 != 0) || (0x14 < uVar11)) goto LAB_00119b12;
      pbVar16 = local_238;
      uVar6 = (ulong)local_238[0];
      while (pbVar16 = pbVar16 + 1, pbVar16 < pbVar27) {
        uVar6 = (ulong)*pbVar16 + uVar6 * 100;
      }
      if ((uVar11 == 0x14) && ((uVar14 = 0, 0x12 < local_238[0] || (-1 < (long)uVar6))))
      goto LAB_00119b12;
      if (SVar1 - STRSCAN_I64 < 2) {
        uVar5 = -uVar6;
        if (local_258 == 0) {
          uVar5 = uVar6;
        }
        o->u64 = uVar5;
        SVar3 = SVar1;
        goto LAB_00119dc2;
      }
      uVar7 = (uint32_t)uVar6;
      if (SVar1 == STRSCAN_U32) {
LAB_00119cc4:
        if (uVar6 >> 0x20 == 0) {
          uVar2 = -uVar7;
          if (local_258 == 0) {
            uVar2 = uVar7;
          }
          (o->u32).lo = uVar2;
          SVar3 = STRSCAN_U32;
          goto LAB_00119dc2;
        }
        goto LAB_00119d5e;
      }
      if (SVar1 == STRSCAN_INT) {
        if (((opt & 2) == 0) && (uVar6 < local_258 + 0x80000000)) {
          uVar2 = -uVar7;
          if (local_258 == 0) {
            uVar2 = uVar7;
          }
          (o->u32).lo = uVar2;
          SVar3 = STRSCAN_INT;
          goto LAB_00119dc2;
        }
        if ((opt & 0x10) != 0) goto LAB_00119cc4;
        SVar1 = STRSCAN_NUM;
      }
      if ((long)uVar6 < 0) {
        uVar14 = 0;
        goto LAB_00119d58;
      }
      dVar31 = (double)(long)uVar6;
      if (local_258 != 0) {
        dVar31 = -dVar31;
      }
    }
    else {
      iVar8 = uVar11 - 800;
      if (uVar11 < 800) {
        iVar8 = 0;
      }
      uVar23 = 800;
      if (uVar11 < 800) {
        uVar23 = uVar11;
      }
      uVar14 = uVar14 + iVar8;
      if (((uVar14 ^ uVar23) & 1) == 0) {
        pbVar27 = local_238;
      }
      else {
        if (bVar12 == 0x2e) {
          bVar12 = p[1];
          p = p + 1;
        }
        pbVar27 = local_238 + 1;
        local_238[0] = bVar12 & 0xf;
        uVar23 = uVar23 - 1;
        p = p + 1;
      }
      for (; 1 < uVar23; uVar23 = uVar23 - 2) {
        bVar13 = *p;
        if (bVar13 == 0x2e) {
          bVar13 = p[1];
          p = p + 1;
        }
        bVar12 = p[1];
        lVar24 = 1;
        if (bVar12 == 0x2e) {
          bVar12 = p[2];
          lVar24 = 2;
        }
        *pbVar27 = (bVar12 & 0xf) + (bVar13 & 0xf) * '\n';
        pbVar27 = pbVar27 + 1;
        p = p + lVar24 + 1;
      }
      if (uVar23 != 0) {
        bVar13 = *p;
        if (bVar13 == 0x2e) {
          bVar13 = p[1];
          p = p + 1;
        }
        *pbVar27 = (bVar13 & 0xf) * '\n';
        pbVar27 = pbVar27 + 1;
        uVar14 = uVar14 - 1;
        uVar11 = uVar11 + 1;
        p = p + 1;
      }
      if (uVar11 < 0x321) {
        for (; (0 < (int)uVar14 && (uVar11 < 0x13)); uVar11 = uVar11 + 2) {
          *pbVar27 = 0;
          pbVar27 = pbVar27 + 1;
          uVar14 = uVar14 - 2;
        }
        goto LAB_00119927;
      }
      do {
        bVar13 = *p;
        if (bVar13 == 0x2e) {
          bVar13 = p[1];
          p = p + 1;
        }
        if (bVar13 != 0x30) {
          pbVar27[-1] = pbVar27[-1] | 1;
          break;
        }
        p = p + 1;
        uVar11 = uVar11 - 1;
      } while (800 < uVar11);
LAB_00119b12:
      iVar8 = (int)pbVar27;
      if (SVar1 == STRSCAN_INT) {
        if ((opt & 0x10) != 0) {
LAB_00119d5e:
          SVar3 = STRSCAN_ERROR;
          goto LAB_00119dc2;
        }
        SVar1 = STRSCAN_NUM;
      }
      else {
LAB_00119d58:
        iVar8 = (int)pbVar27;
        if (STRSCAN_INT < SVar1) goto LAB_00119d5e;
      }
      uVar23 = iVar8 - (int)local_238;
      iVar8 = ((int)uVar14 >> 1) + uVar23;
      if (0x9b < iVar8) {
        uVar6 = 0x7ff0000000000000;
        uVar9 = 0xfff0000000000000;
        goto LAB_00119d8e;
      }
      if (-0xa4 < iVar8) {
        uVar6 = 0;
        uVar11 = 0;
        while ((iVar8 < 9 && (uVar14 = (uint)uVar6, iVar8 < (int)(uVar23 - uVar14 & 0x1ff)))) {
          uVar26 = uVar23 + 0x1ff;
          uVar18 = 0;
          while( true ) {
            uVar26 = uVar26 & 0x1ff;
            uVar21 = (uint)local_238[uVar26] * 0x40 + uVar18;
            uVar18 = uVar21 / 100;
            local_238[uVar26] = (byte)(uVar21 % 100);
            if (uVar26 == uVar14) break;
            if (uVar21 % 100 == 0 && (uVar23 - 1 & 0x1ff) == uVar26) {
              uVar23 = uVar26;
            }
            uVar26 = uVar26 - 1;
          }
          uVar11 = uVar11 - 6;
          if (99 < uVar21) {
            uVar21 = uVar14 - 1 & 0x1ff;
            uVar6 = (ulong)uVar21;
            uVar26 = uVar23 - 1 & 0x1ff;
            uVar14 = uVar26;
            if ((local_238[uVar26] != 0) && (uVar14 = uVar23, uVar21 == uVar23)) {
              local_238[uVar23 + 0x1fe & 0x1ff] =
                   local_238[uVar23 + 0x1fe & 0x1ff] | local_238[uVar26];
              uVar14 = uVar26;
            }
            uVar23 = uVar14;
            local_238[uVar6] = (byte)uVar18;
            iVar8 = iVar8 + 1;
          }
        }
LAB_00119f6e:
        if (9 < iVar8) {
          uVar10 = 0;
          uVar9 = uVar6;
          do {
            iVar15 = (int)uVar6;
            uVar14 = (uint)local_238[uVar6] + (int)uVar10;
            local_238[uVar6] = (byte)(uVar14 >> 6);
            uVar10 = (ulong)((uVar14 & 0x3f) * 100);
            iVar19 = (int)uVar9;
            bVar28 = (uVar14 & 0x3fc0) == 0;
            uVar17 = (ulong)(iVar19 + 1U & 0x1ff);
            if (iVar15 != iVar19 || !bVar28) {
              uVar17 = uVar9;
            }
            iVar8 = iVar8 - (uint)(iVar15 == iVar19 && bVar28);
            uVar14 = iVar15 + 1U & 0x1ff;
            uVar6 = (ulong)uVar14;
            uVar9 = uVar17;
          } while (uVar14 != uVar23);
          uVar11 = uVar11 + 6;
          uVar14 = uVar23;
          for (; uVar6 = uVar17, uVar23 = uVar14, (uint)uVar10 != 0;
              uVar10 = (ulong)(((uint)uVar10 & 0x3c) * 100)) {
            uVar23 = (uint)uVar17;
            if (uVar23 == uVar14) {
              local_238[uVar23 - 1 & 0x1ff] = local_238[uVar23 - 1 & 0x1ff] | 1;
              break;
            }
            local_238[uVar14] = (byte)(uVar10 >> 6);
            uVar14 = uVar14 + 1 & 0x1ff;
          }
          goto LAB_00119f6e;
        }
        uVar9 = (ulong)local_238[uVar6];
        while( true ) {
          uVar14 = (int)uVar6 + 1U & 0x1ff;
          uVar6 = (ulong)uVar14;
          if ((iVar8 < 2) || (uVar14 == uVar23)) break;
          uVar9 = (ulong)local_238[uVar6] + uVar9 * 100;
          iVar8 = iVar8 + -1;
        }
        if (uVar14 == uVar23) {
          while (iVar8 = iVar8 + -1, 0 < iVar8) {
            uVar9 = uVar9 * 100;
          }
        }
        else {
          uVar9 = uVar9 * 2;
          uVar11 = uVar11 - 1;
          do {
            if (local_238[uVar6] != 0) {
              uVar9 = uVar9 | 1;
              break;
            }
            uVar14 = (int)uVar6 + 1U & 0x1ff;
            uVar6 = (ulong)uVar14;
          } while (uVar14 != uVar23);
        }
        goto LAB_00119be5;
      }
      dVar31 = 0.0;
      if (local_258 != 0) {
        dVar31 = -0.0;
      }
    }
    o->u64 = (uint64_t)dVar31;
    SVar3 = SVar1;
  }
LAB_00119dc2:
  if ((opt & 1) == 0) {
    return SVar3;
  }
  if (SVar3 != STRSCAN_NUM) {
    return SVar3;
  }
  dVar31 = o->n;
  if (dVar31 != (double)(int)dVar31) {
    return STRSCAN_NUM;
  }
  if (NAN(dVar31) || NAN((double)(int)dVar31)) {
    return STRSCAN_NUM;
  }
  uVar7 = (int)dVar31;
LAB_00119e0d:
  (o->u32).lo = uVar7;
  return STRSCAN_INT;
}

Assistant:

StrScanFmt lj_strscan_scan(const uint8_t *p, MSize len, TValue *o,
			   uint32_t opt)
{
  int32_t neg = 0;
  const uint8_t *pe = p + len;

  /* Remove leading space, parse sign and non-numbers. */
  if (LJ_UNLIKELY(!lj_char_isdigit(*p))) {
    while (lj_char_isspace(*p)) p++;
    if (*p == '+' || *p == '-') neg = (*p++ == '-');
    if (LJ_UNLIKELY(*p >= 'A')) {  /* Parse "inf", "infinity" or "nan". */
      TValue tmp;
      setnanV(&tmp);
      if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'f')) {
	if (neg) setminfV(&tmp); else setpinfV(&tmp);
	p += 3;
	if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'i') &&
	    casecmp(p[3],'t') && casecmp(p[4],'y')) p += 5;
      } else if (casecmp(p[0],'n') && casecmp(p[1],'a') && casecmp(p[2],'n')) {
	p += 3;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p || p < pe) return STRSCAN_ERROR;
      o->u64 = tmp.u64;
      return STRSCAN_NUM;
    }
  }

  /* Parse regular number. */
  {
    StrScanFmt fmt = STRSCAN_INT;
    int cmask = LJ_CHAR_DIGIT;
    int base = (opt & STRSCAN_OPT_C) && *p == '0' ? 0 : 10;
    const uint8_t *sp, *dp = NULL;
    uint32_t dig = 0, hasdig = 0, x = 0;
    int32_t ex = 0;

    /* Determine base and skip leading zeros. */
    if (LJ_UNLIKELY(*p <= '0')) {
      if (*p == '0') {
	if (casecmp(p[1], 'x'))
	  base = 16, cmask = LJ_CHAR_XDIGIT, p += 2;
	else if (casecmp(p[1], 'b'))
	  base = 2, cmask = LJ_CHAR_DIGIT, p += 2;
      }
      for ( ; ; p++) {
	if (*p == '0') {
	  hasdig = 1;
	} else if (*p == '.') {
	  if (dp) return STRSCAN_ERROR;
	  dp = p;
	} else {
	  break;
	}
      }
    }

    /* Preliminary digit and decimal point scan. */
    for (sp = p; ; p++) {
      if (LJ_LIKELY(lj_char_isa(*p, cmask))) {
	x = x * 10 + (*p & 15);  /* For fast path below. */
	dig++;
      } else if (*p == '.') {
	if (dp) return STRSCAN_ERROR;
	dp = p;
      } else {
	break;
      }
    }
    if (!(hasdig | dig)) return STRSCAN_ERROR;

    /* Handle decimal point. */
    if (dp) {
      if (base == 2) return STRSCAN_ERROR;
      fmt = STRSCAN_NUM;
      if (dig) {
	ex = (int32_t)(dp-(p-1)); dp = p-1;
	while (ex < 0 && *dp-- == '0') ex++, dig--;  /* Skip trailing zeros. */
	if (ex <= -STRSCAN_MAXEXP) return STRSCAN_ERROR;
	if (base == 16) ex *= 4;
      }
    }

    /* Parse exponent. */
    if (base >= 10 && casecmp(*p, (uint32_t)(base == 16 ? 'p' : 'e'))) {
      uint32_t xx;
      int negx = 0;
      fmt = STRSCAN_NUM; p++;
      if (*p == '+' || *p == '-') negx = (*p++ == '-');
      if (!lj_char_isdigit(*p)) return STRSCAN_ERROR;
      xx = (*p++ & 15);
      while (lj_char_isdigit(*p)) {
	xx = xx * 10 + (*p & 15);
	if (xx >= STRSCAN_MAXEXP) return STRSCAN_ERROR;
	p++;
      }
      ex += negx ? (int32_t)(~xx+1u) : (int32_t)xx;
    }

    /* Parse suffix. */
    if (*p) {
      /* I (IMAG), U (U32), LL (I64), ULL/LLU (U64), L (long), UL/LU (ulong). */
      /* NYI: f (float). Not needed until cp_number() handles non-integers. */
      if (casecmp(*p, 'i')) {
	if (!(opt & STRSCAN_OPT_IMAG)) return STRSCAN_ERROR;
	p++; fmt = STRSCAN_IMAG;
      } else if (fmt == STRSCAN_INT) {
	if (casecmp(*p, 'u')) p++, fmt = STRSCAN_U32;
	if (casecmp(*p, 'l')) {
	  p++;
	  if (casecmp(*p, 'l')) p++, fmt += STRSCAN_I64 - STRSCAN_INT;
	  else if (!(opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
	  else if (sizeof(long) == 8) fmt += STRSCAN_I64 - STRSCAN_INT;
	}
	if (casecmp(*p, 'u') && (fmt == STRSCAN_INT || fmt == STRSCAN_I64))
	  p++, fmt += STRSCAN_U32 - STRSCAN_INT;
	if ((fmt == STRSCAN_U32 && !(opt & STRSCAN_OPT_C)) ||
	    (fmt >= STRSCAN_I64 && !(opt & STRSCAN_OPT_LL)))
	  return STRSCAN_ERROR;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p) return STRSCAN_ERROR;
    }
    if (p < pe) return STRSCAN_ERROR;

    /* Fast path for decimal 32 bit integers. */
    if (fmt == STRSCAN_INT && base == 10 &&
	(dig < 10 || (dig == 10 && *sp <= '2' && x < 0x80000000u+neg))) {
      if ((opt & STRSCAN_OPT_TONUM)) {
	o->n = neg ? -(double)x : (double)x;
	return STRSCAN_NUM;
      } else if (x == 0 && neg) {
	o->n = -0.0;
	return STRSCAN_NUM;
      } else {
	o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	return STRSCAN_INT;
      }
    }

    /* Dispatch to base-specific parser. */
    if (base == 0 && !(fmt == STRSCAN_NUM || fmt == STRSCAN_IMAG))
      return strscan_oct(sp, o, fmt, neg, dig);
    if (base == 16)
      fmt = strscan_hex(sp, o, fmt, opt, ex, neg, dig);
    else if (base == 2)
      fmt = strscan_bin(sp, o, fmt, opt, ex, neg, dig);
    else
      fmt = strscan_dec(sp, o, fmt, opt, ex, neg, dig);

    /* Try to convert number to integer, if requested. */
    if (fmt == STRSCAN_NUM && (opt & STRSCAN_OPT_TOINT) && !tvismzero(o)) {
      double n = o->n;
      int32_t i = lj_num2int(n);
      if (n == (lua_Number)i) { o->i = i; return STRSCAN_INT; }
    }
    return fmt;
  }
}